

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O0

int __thiscall Jzon::Node::remove(Node *this,char *__filename)

{
  bool bVar1;
  __type _Var2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  reference __lhs;
  iterator iVar4;
  const_iterator local_38;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>_>
  local_30;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>_>
  local_28;
  iterator it;
  NamedNodeList *children;
  string *name_local;
  Node *this_local;
  int iVar3;
  
  bVar1 = isObject(this);
  iVar3 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    detach(this);
    it._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>
          *)&this->data->children;
    local_28._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
            ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
                     *)it._M_current);
    while( true ) {
      local_30._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
              ::end(it._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
      iVar3 = (int)CONCAT71(extraout_var_00,bVar1);
      if (!bVar1) break;
      __lhs = __gnu_cxx::
              __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>_>
              ::operator*(&local_28);
      _Var2 = std::operator==(&__lhs->first,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __filename);
      iVar4 = it;
      if (_Var2) {
        __gnu_cxx::
        __normal_iterator<std::pair<std::__cxx11::string,Jzon::Node>const*,std::vector<std::pair<std::__cxx11::string,Jzon::Node>,std::allocator<std::pair<std::__cxx11::string,Jzon::Node>>>>
        ::__normal_iterator<std::pair<std::__cxx11::string,Jzon::Node>*>
                  ((__normal_iterator<std::pair<std::__cxx11::string,Jzon::Node>const*,std::vector<std::pair<std::__cxx11::string,Jzon::Node>,std::allocator<std::pair<std::__cxx11::string,Jzon::Node>>>>
                    *)&local_38,&local_28);
        iVar4 = std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
                ::erase(iVar4._M_current,local_38);
        return (int)iVar4._M_current;
      }
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>_>
      ::operator++(&local_28);
    }
  }
  return iVar3;
}

Assistant:

void Node::remove(const std::string &name)
	{
		if (isObject())
		{
			detach();
			NamedNodeList &children = data->children;
			for (NamedNodeList::iterator it = children.begin(); it != children.end(); ++it)
			{
				if ((*it).first == name)
				{
					children.erase(it);
					break;
				}
			}
		}
	}